

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronValidCtxtPtr xmlSchematronNewValidCtxt(xmlSchematronPtr schema,int options)

{
  xmlXPathContextPtr pxVar1;
  xmlSchematronValidCtxtPtr ret;
  int i;
  int options_local;
  xmlSchematronPtr schema_local;
  
  schema_local = (xmlSchematronPtr)(*xmlMalloc)(0x70);
  if ((xmlSchematronValidCtxtPtr)schema_local == (xmlSchematronValidCtxtPtr)0x0) {
    xmlSchematronVErrMemory
              ((xmlSchematronValidCtxtPtr)0x0,"allocating validation context",(xmlNodePtr)0x0);
    schema_local = (xmlSchematronPtr)0x0;
  }
  else {
    memset(schema_local,0,0x70);
    ((xmlSchematronValidCtxtPtr)schema_local)->type = 2;
    ((xmlSchematronValidCtxtPtr)schema_local)->schema = schema;
    pxVar1 = xmlXPathNewContext((xmlDocPtr)0x0);
    ((xmlSchematronValidCtxtPtr)schema_local)->xctxt = pxVar1;
    ((xmlSchematronValidCtxtPtr)schema_local)->flags = options;
    if (((xmlSchematronValidCtxtPtr)schema_local)->xctxt == (xmlXPathContextPtr)0x0) {
      xmlSchematronPErrMemory
                ((xmlSchematronParserCtxtPtr)0x0,"allocating schema parser XPath context",
                 (xmlNodePtr)0x0);
      xmlSchematronFreeValidCtxt((xmlSchematronValidCtxtPtr)schema_local);
      schema_local = (xmlSchematronPtr)0x0;
    }
    else {
      ret._0_4_ = 0;
      while ((((int)ret < schema->nbNamespaces &&
              (schema->namespaces[(int)ret << 1] != (xmlChar *)0x0)) &&
             (schema->namespaces[(int)ret * 2 + 1] != (xmlChar *)0x0))) {
        xmlXPathRegisterNs(((xmlSchematronValidCtxtPtr)schema_local)->xctxt,
                           schema->namespaces[(int)ret * 2 + 1],schema->namespaces[(int)ret << 1]);
        ret._0_4_ = (int)ret + 1;
      }
    }
  }
  return (xmlSchematronValidCtxtPtr)schema_local;
}

Assistant:

xmlSchematronValidCtxtPtr
xmlSchematronNewValidCtxt(xmlSchematronPtr schema, int options)
{
    int i;
    xmlSchematronValidCtxtPtr ret;

    ret = (xmlSchematronValidCtxtPtr) xmlMalloc(sizeof(xmlSchematronValidCtxt));
    if (ret == NULL) {
        xmlSchematronVErrMemory(NULL, "allocating validation context",
                                NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronValidCtxt));
    ret->type = XML_STRON_CTXT_VALIDATOR;
    ret->schema = schema;
    ret->xctxt = xmlXPathNewContext(NULL);
    ret->flags = options;
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser XPath context",
                                NULL);
	xmlSchematronFreeValidCtxt(ret);
        return (NULL);
    }
    for (i = 0;i < schema->nbNamespaces;i++) {
        if ((schema->namespaces[2 * i] == NULL) ||
            (schema->namespaces[2 * i + 1] == NULL))
	    break;
	xmlXPathRegisterNs(ret->xctxt, schema->namespaces[2 * i + 1],
	                   schema->namespaces[2 * i]);
    }
    return (ret);
}